

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall
Json::BuiltStyledStreamWriter::writeArrayValue(BuiltStyledStreamWriter *this,Value *value)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  reference pvVar4;
  long in_RDI;
  uint index_1;
  Value *childValue;
  uint index;
  bool hasChildValue;
  bool isMultiLine;
  uint size;
  ArrayIndex in_stack_00000124;
  Value *in_stack_00000128;
  Value *in_stack_00000158;
  BuiltStyledStreamWriter *in_stack_00000160;
  string *in_stack_ffffffffffffff28;
  ostream *poVar5;
  BuiltStyledStreamWriter *in_stack_ffffffffffffff30;
  BuiltStyledStreamWriter *this_00;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 uVar6;
  Value *in_stack_ffffffffffffff48;
  allocator *paVar7;
  undefined4 in_stack_ffffffffffffff58;
  uint uVar8;
  undefined4 in_stack_ffffffffffffff5c;
  BuiltStyledStreamWriter *in_stack_ffffffffffffff60;
  ArrayIndex local_78;
  string local_70 [8];
  undefined8 in_stack_ffffffffffffff98;
  BuiltStyledStreamWriter *in_stack_ffffffffffffffa0;
  Value *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  string local_38 [56];
  
  local_38._36_4_ = Value::size(in_stack_ffffffffffffff48);
  if (local_38._36_4_ == 0) {
    paVar7 = (allocator *)&stack0xffffffffffffffc7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"[]",paVar7);
    pushValue(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  }
  else {
    uVar6 = true;
    if (*(int *)(in_RDI + 0x70) != 2) {
      uVar6 = isMultineArray(in_stack_ffffffffffffff60,
                             (Value *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
      ;
    }
    if ((bool)uVar6 == false) {
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(in_RDI + 0x10));
      if (sVar2 != (uint)local_38._36_4_) {
        __assert_fail("childValues_.size() == size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/lib_json/json_writer.cpp"
                      ,0x3bf,"void Json::BuiltStyledStreamWriter::writeArrayValue(const Value &)");
      }
      std::operator<<(*(ostream **)(in_RDI + 8),"[");
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::operator<<(*(ostream **)(in_RDI + 8)," ");
      }
      for (uVar8 = 0; uVar8 < (uint)local_38._36_4_; uVar8 = uVar8 + 1) {
        if (uVar8 != 0) {
          std::operator<<(*(ostream **)(in_RDI + 8),", ");
        }
        poVar5 = *(ostream **)(in_RDI + 8);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(in_RDI + 0x10),(ulong)uVar8);
        std::operator<<(poVar5,(string *)pvVar4);
      }
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::operator<<(*(ostream **)(in_RDI + 8)," ");
      }
      std::operator<<(*(ostream **)(in_RDI + 8),"]");
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"[",(allocator *)&stack0xffffffffffffff8f);
      writeWithIndent(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
      indent((BuiltStyledStreamWriter *)0x192917);
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT17(uVar6,in_stack_ffffffffffffff40));
      local_78 = 0;
      while( true ) {
        Value::operator[](in_stack_00000128,in_stack_00000124);
        writeCommentBeforeValue(in_stack_ffffffffffffffa0,(Value *)in_stack_ffffffffffffff98);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          if ((*(byte *)(in_RDI + 0xd8) >> 1 & 1) == 0) {
            writeIndent(in_stack_ffffffffffffff30);
          }
          *(byte *)(in_RDI + 0xd8) = *(byte *)(in_RDI + 0xd8) & 0xfd | 2;
          writeValue(in_stack_00000160,in_stack_00000158);
          *(byte *)(in_RDI + 0xd8) = *(byte *)(in_RDI + 0xd8) & 0xfd;
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(in_RDI + 0x10),(ulong)local_78);
          writeWithIndent(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        }
        local_78 = local_78 + 1;
        if (local_78 == local_38._36_4_) break;
        std::operator<<(*(ostream **)(in_RDI + 8),",");
        writeCommentAfterValueOnSameLine
                  ((BuiltStyledStreamWriter *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
      writeCommentAfterValueOnSameLine
                ((BuiltStyledStreamWriter *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      unindent((BuiltStyledStreamWriter *)CONCAT17(uVar6,in_stack_ffffffffffffff40));
      this_00 = (BuiltStyledStreamWriter *)&stack0xffffffffffffff5f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xffffffffffffff60,"]",(allocator *)this_00);
      writeWithIndent(this_00,in_stack_ffffffffffffff28);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff5f);
    }
  }
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeArrayValue(Value const& value) {
  unsigned size = value.size();
  if (size == 0)
    pushValue("[]");
  else {
    bool isMultiLine = (cs_ == CommentStyle::All) || isMultineArray(value);
    if (isMultiLine) {
      writeWithIndent("[");
      indent();
      bool hasChildValue = !childValues_.empty();
      unsigned index = 0;
      for (;;) {
        Value const& childValue = value[index];
        writeCommentBeforeValue(childValue);
        if (hasChildValue)
          writeWithIndent(childValues_[index]);
        else {
          if (!indented_) writeIndent();
          indented_ = true;
          writeValue(childValue);
          indented_ = false;
        }
        if (++index == size) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        *sout_ << ",";
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("]");
    } else // output on a single line
    {
      assert(childValues_.size() == size);
      *sout_ << "[";
      if (!indentation_.empty()) *sout_ << " ";
      for (unsigned index = 0; index < size; ++index) {
        if (index > 0)
          *sout_ << ", ";
        *sout_ << childValues_[index];
      }
      if (!indentation_.empty()) *sout_ << " ";
      *sout_ << "]";
    }
  }
}